

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvObjSlot<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var pvVar1;
  Var slotArray;
  OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  Var instance_local;
  InterpreterStackFrame *this_local;
  
  pvVar1 = OP_LdFrameDisplaySlot(this,instance,(uint)playout->SlotIndex1);
  pvVar1 = OP_LdObjSlot(this,pvVar1,(uint)playout->SlotIndex2);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvObjSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdObjSlot(slotArray, playout->SlotIndex2);
    }